

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O3

void __thiscall
IR::Opnd::GetAddrDescription
          (Opnd *this,char16 *description,size_t count,bool AsmDumpMode,bool printToConsole,
          Func *func)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  undefined7 in_register_00000009;
  char16 *local_48;
  char16 *buffer;
  size_t n;
  
  local_48 = description;
  buffer = (char16 *)count;
  if (this->m_kind != OpndKindAddr) {
    n._4_4_ = (undefined4)CONCAT71(in_register_00000009,AsmDumpMode);
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x18e,"(this->IsAddrOpnd())","Bad call to AsAddrOpnd()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    AsmDumpMode = SUB41(n._4_4_,0);
  }
  if (this[3]._vptr_Opnd == (_func_int **)0x0) {
    GetAddrDescription(description,count,this[2]._vptr_Opnd,
                       *(AddrOpndKind *)((long)&this[2].m_valueType.field_0.bits + 1),false,
                       printToConsole,func,false);
  }
  else {
    GetAddrDescription(description,count,this[3]._vptr_Opnd,
                       *(AddrOpndKind *)((long)&this[2].m_valueType.field_0.bits + 1),false,
                       printToConsole,func,false);
    if (AsmDumpMode == false) {
      WriteToBuffer(&local_48,(size_t *)&buffer,L" [encoded: 0x%08X",this[2]._vptr_Opnd);
    }
    else {
      WriteToBuffer(&local_48,(size_t *)&buffer,L" [encoded]");
    }
  }
  description[count - 1] = L'\0';
  return;
}

Assistant:

void
Opnd::GetAddrDescription(__out_ecount(count) char16 *const description, const size_t count, bool AsmDumpMode,
                         bool printToConsole, Func *func)
{
    char16 *buffer = description;
    size_t n = count;

    IR::AddrOpnd * addrOpnd = this->AsAddrOpnd();
    Js::Var address;

    bool isEncoded = false;
    if (addrOpnd->decodedValue != 0)
    {
        address = addrOpnd->decodedValue;
        isEncoded = true;
    }
    else
    {
        address = addrOpnd->m_address;
    }

    GetAddrDescription(description, count, address, addrOpnd->GetAddrOpndKind(), AsmDumpMode, printToConsole, func);

    if (isEncoded)
    {
        if (AsmDumpMode)
        {
            WriteToBuffer(&buffer, &n, _u(" [encoded]"));
        }
        else
        {
            WriteToBuffer(&buffer, &n, _u(" [encoded: 0x%08X"), addrOpnd->m_address);
        }
    }

    description[count-1] = 0;  // force null termination
}